

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldAccessor::RemoveLast(MapFieldAccessor *this,Field *data)

{
  int iVar1;
  RepeatedPtrFieldBase *pRVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  pRVar2 = MapFieldBase::MutableRepeatedField((MapFieldBase *)data);
  if (pRVar2->current_size_ < 1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x397);
    other = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  iVar1 = pRVar2->current_size_;
  pRVar2->current_size_ = iVar1 + -1;
  (**(code **)(*pRVar2->rep_->elements[(long)iVar1 + -1] + 0x20))();
  return;
}

Assistant:

void RemoveLast(Field* data) const override {
    MutableRepeatedField(data)->RemoveLast();
  }